

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O0

void Acec_MultFuncTest6(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  word local_30;
  word Canon;
  word Truth;
  word Entry;
  Vec_Wrd_t *pVStack_10;
  int i;
  Vec_Wrd_t *vRes;
  
  pVStack_10 = Vec_WrdAlloc(10000);
  Canon = 0xfedcba9876543210;
  local_30 = Extra_TruthCanonNPN3(0xfedcba9876543210,6,pVStack_10);
  Extra_PrintHex(_stdout,(uint *)&Canon,6);
  printf("\n");
  Extra_PrintHex(_stdout,(uint *)&local_30,6);
  printf("\n");
  uVar2 = Vec_WrdSize(pVStack_10);
  printf("Members = %d.\n",(ulong)uVar2);
  for (Entry._4_4_ = 0; iVar1 = Entry._4_4_, iVar3 = Vec_WrdSize(pVStack_10), iVar1 < iVar3;
      Entry._4_4_ = Entry._4_4_ + 1) {
    Truth = Vec_WrdEntry(pVStack_10,Entry._4_4_);
    Extra_PrintHex(_stdout,(uint *)&Truth,6);
    printf(", ");
    if (Entry._4_4_ % 8 == 7) {
      printf("\n");
    }
  }
  Vec_WrdFree(pVStack_10);
  return;
}

Assistant:

void Acec_MultFuncTest6()
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 10000 );
    int i; word Entry;

    word Truth = ABC_CONST(0xfedcba9876543210);
    word Canon = Extra_TruthCanonNPN3( Truth, 6, vRes );

    Extra_PrintHex( stdout, (unsigned*)&Truth, 6 );  printf( "\n" );
    Extra_PrintHex( stdout, (unsigned*)&Canon, 6 );  printf( "\n" );

    printf( "Members = %d.\n", Vec_WrdSize(vRes) );
    Vec_WrdForEachEntry( vRes, Entry, i )
    {
        Extra_PrintHex( stdout, (unsigned*)&Entry, 6 );  
        printf( ", " );
        if ( i % 8 == 7 )
            printf( "\n" );
    }

    Vec_WrdFree( vRes );
}